

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_dual.cpp
# Opt level: O0

void __thiscall
cppcms::sessions::session_dual::session_dual
          (session_dual *this,
          unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
          *enc,shared_ptr<cppcms::sessions::session_storage> *storage,size_t limit)

{
  session_sid *this_00;
  undefined8 in_RCX;
  undefined8 *in_RDI;
  session_cookies *in_stack_ffffffffffffff58;
  session_sid *__p;
  shared_ptr<cppcms::sessions::session_cookies> *in_stack_ffffffffffffff60;
  shared_ptr<cppcms::sessions::session_sid> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  shared_ptr<cppcms::sessions::session_storage> *st;
  session_sid local_50;
  undefined8 local_20;
  
  local_20 = in_RCX;
  session_api::session_api((session_api *)in_stack_ffffffffffffff60);
  *in_RDI = &PTR_save_0052f600;
  booster::hold_ptr<cppcms::sessions::session_dual::_data>::hold_ptr
            ((hold_ptr<cppcms::sessions::session_dual::_data> *)(in_RDI + 1));
  st = (shared_ptr<cppcms::sessions::session_storage> *)(in_RDI + 2);
  this_00 = (session_sid *)operator_new(0x18);
  local_50.storage_.
  super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr._7_1_ = 1
  ;
  this_02 = &local_50.storage_.
             super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>::
  unique_ptr((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
              *)in_stack_ffffffffffffff60,
             (unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
              *)in_stack_ffffffffffffff58);
  session_cookies::session_cookies
            ((session_cookies *)this_00,
             (unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
              *)st);
  local_50.storage_.
  super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr._7_1_ = 0
  ;
  std::shared_ptr<cppcms::sessions::session_cookies>::
  shared_ptr<cppcms::sessions::session_cookies,void>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>::
  ~unique_ptr((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
               *)this_02);
  this_01 = (shared_ptr<cppcms::sessions::session_sid> *)(in_RDI + 4);
  operator_new(0x20);
  __p = &local_50;
  std::shared_ptr<cppcms::sessions::session_storage>::shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage> *)this_01,
             (shared_ptr<cppcms::sessions::session_storage> *)__p);
  session_sid::session_sid(this_00,st);
  std::shared_ptr<cppcms::sessions::session_sid>::shared_ptr<cppcms::sessions::session_sid,void>
            (this_01,__p);
  std::shared_ptr<cppcms::sessions::session_storage>::~shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage> *)0x43d5f6);
  in_RDI[6] = local_20;
  return;
}

Assistant:

session_dual::session_dual(std::unique_ptr<encryptor> enc,booster::shared_ptr<session_storage> storage,size_t limit) :
	client_(new session_cookies(std::move(enc))),
	server_(new session_sid(std::move(storage))),
	data_size_limit_(limit)
{
}